

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::ErrorCheckEndFrameRecover(ImGuiErrorLogCallback log_callback,void *user_data)

{
  ImVector<unsigned_int> *pIVar1;
  int iVar2;
  ImGuiWindow *pIVar3;
  char *pcVar4;
  ImGuiContext *pIVar5;
  char *pcVar6;
  ImGuiWindow *pIVar7;
  
  pIVar5 = GImGui;
  while( true ) {
    if ((pIVar5->CurrentWindowStack).Size < 1) {
      return;
    }
    pIVar3 = pIVar5->CurrentWindow;
    while (pIVar5->CurrentTabBar != (ImGuiTabBar *)0x0) {
      if (log_callback != (ImGuiErrorLogCallback)0x0) {
        (*log_callback)(user_data,"Recovered from missing EndTabBar() in \'%s\'",pIVar3->Name);
      }
      EndTabBar();
    }
    while (pIVar7 = pIVar5->CurrentWindow, 0 < (pIVar7->DC).TreeDepth) {
      if (log_callback != (ImGuiErrorLogCallback)0x0) {
        (*log_callback)(user_data,"Recovered from missing TreePop() in \'%s\'",pIVar3->Name);
      }
      TreePop();
    }
    while ((int)(pIVar7->DC).StackSizesOnBegin.SizeOfGroupStack < (pIVar5->GroupStack).Size) {
      if (log_callback != (ImGuiErrorLogCallback)0x0) {
        (*log_callback)(user_data,"Recovered from missing EndGroup() in \'%s\'",pIVar3->Name);
      }
      EndGroup();
      pIVar7 = pIVar5->CurrentWindow;
    }
    while (1 < (pIVar7->IDStack).Size) {
      if (log_callback != (ImGuiErrorLogCallback)0x0) {
        (*log_callback)(user_data,"Recovered from missing PopID() in \'%s\'",pIVar3->Name);
        pIVar7 = pIVar5->CurrentWindow;
      }
      pIVar1 = &GImGui->CurrentWindow->IDStack;
      pIVar1->Size = pIVar1->Size + -1;
    }
    while (iVar2 = (pIVar5->ColorStack).Size,
          (pIVar7->DC).StackSizesOnBegin.SizeOfColorStack < iVar2) {
      if (log_callback != (ImGuiErrorLogCallback)0x0) {
        pcVar4 = pIVar3->Name;
        pcVar6 = GetStyleColorName((pIVar5->ColorStack).Data[(long)iVar2 + -1].Col);
        (*log_callback)(user_data,"Recovered from missing PopStyleColor() in \'%s\' for ImGuiCol_%s"
                        ,pcVar4,pcVar6);
      }
      PopStyleColor(1);
      pIVar7 = pIVar5->CurrentWindow;
    }
    while ((int)(pIVar7->DC).StackSizesOnBegin.SizeOfStyleVarStack < (pIVar5->StyleVarStack).Size) {
      if (log_callback != (ImGuiErrorLogCallback)0x0) {
        (*log_callback)(user_data,"Recovered from missing PopStyleVar() in \'%s\'",pIVar3->Name);
      }
      PopStyleVar(1);
      pIVar7 = pIVar5->CurrentWindow;
    }
    while ((int)(pIVar7->DC).StackSizesOnBegin.SizeOfFocusScopeStack <
           (pIVar5->FocusScopeStack).Size) {
      if (log_callback != (ImGuiErrorLogCallback)0x0) {
        (*log_callback)(user_data,"Recovered from missing PopFocusScope() in \'%s\'",pIVar3->Name);
      }
      PopFocusScope();
      pIVar7 = pIVar5->CurrentWindow;
    }
    if ((pIVar5->CurrentWindowStack).Size == 1) break;
    if ((pIVar7->Flags & 0x1000000) == 0) {
      if (log_callback != (ImGuiErrorLogCallback)0x0) {
        (*log_callback)(user_data,"Recovered from missing End() for \'%s\'",pIVar3->Name);
      }
      End();
    }
    else {
      if (log_callback != (ImGuiErrorLogCallback)0x0) {
        (*log_callback)(user_data,"Recovered from missing EndChild() for \'%s\'",pIVar3->Name);
      }
      EndChild();
    }
  }
  return;
}

Assistant:

void    ImGui::ErrorCheckEndFrameRecover(ImGuiErrorLogCallback log_callback, void* user_data)
{
    // PVS-Studio V1044 is "Loop break conditions do not depend on the number of iterations"
    ImGuiContext& g = *GImGui;
    while (g.CurrentWindowStack.Size > 0)
    {
#ifdef IMGUI_HAS_TABLE
        while (g.CurrentTable && (g.CurrentTable->OuterWindow == g.CurrentWindow || g.CurrentTable->InnerWindow == g.CurrentWindow))
        {
            if (log_callback) log_callback(user_data, "Recovered from missing EndTable() in '%s'", g.CurrentTable->OuterWindow->Name);
            EndTable();
        }
#endif
        ImGuiWindow* window = g.CurrentWindow;
        while (g.CurrentTabBar != NULL) //-V1044
        {
            if (log_callback) log_callback(user_data, "Recovered from missing EndTabBar() in '%s'", window->Name);
            EndTabBar();
        }
        while (g.CurrentWindow->DC.TreeDepth > 0) //-V1044
        {
            if (log_callback) log_callback(user_data, "Recovered from missing TreePop() in '%s'", window->Name);
            TreePop();
        }
        while (g.GroupStack.Size > g.CurrentWindow->DC.StackSizesOnBegin.SizeOfGroupStack) //-V1044
        {
            if (log_callback) log_callback(user_data, "Recovered from missing EndGroup() in '%s'", window->Name);
            EndGroup();
        }
        while (g.CurrentWindow->IDStack.Size > 1) //-V1044
        {
            if (log_callback) log_callback(user_data, "Recovered from missing PopID() in '%s'", window->Name);
            PopID();
        }
        while (g.ColorStack.Size > g.CurrentWindow->DC.StackSizesOnBegin.SizeOfColorStack) //-V1044
        {
            if (log_callback) log_callback(user_data, "Recovered from missing PopStyleColor() in '%s' for ImGuiCol_%s", window->Name, GetStyleColorName(g.ColorStack.back().Col));
            PopStyleColor();
        }
        while (g.StyleVarStack.Size > g.CurrentWindow->DC.StackSizesOnBegin.SizeOfStyleVarStack) //-V1044
        {
            if (log_callback) log_callback(user_data, "Recovered from missing PopStyleVar() in '%s'", window->Name);
            PopStyleVar();
        }
        while (g.FocusScopeStack.Size > g.CurrentWindow->DC.StackSizesOnBegin.SizeOfFocusScopeStack) //-V1044
        {
            if (log_callback) log_callback(user_data, "Recovered from missing PopFocusScope() in '%s'", window->Name);
            PopFocusScope();
        }
        if (g.CurrentWindowStack.Size == 1)
        {
            IM_ASSERT(g.CurrentWindow->IsFallbackWindow);
            break;
        }
        if (g.CurrentWindow->Flags & ImGuiWindowFlags_ChildWindow)
        {
            if (log_callback) log_callback(user_data, "Recovered from missing EndChild() for '%s'", window->Name);
            EndChild();
        }
        else
        {
            if (log_callback) log_callback(user_data, "Recovered from missing End() for '%s'", window->Name);
            End();
        }
    }
}